

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::EnforceUniqueName(cmMakefile *this,string *name,string *msg,bool isCustom)

{
  cmake *pcVar1;
  cmState *this_00;
  bool bVar2;
  byte bVar3;
  PolicyStatus PVar4;
  TargetType TVar5;
  ostream *poVar6;
  cmTarget *this_01;
  cmMakefile *pcVar7;
  string *psVar8;
  PolicyID id;
  byte unaff_R13B;
  string asStack_1c8 [32];
  ostringstream e;
  
  bVar2 = IsAlias(this,name);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar6 = std::operator<<((ostream *)&e,"cannot create target \"");
    poVar6 = std::operator<<(poVar6,(string *)name);
    std::operator<<(poVar6,"\" because an alias with the same name already exists.");
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)msg,asStack_1c8);
    std::__cxx11::string::~string(asStack_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    bVar3 = 0;
    goto LAB_0018f8e7;
  }
  this_01 = FindTargetToUse(this,name,false);
  if (this_01 != (cmTarget *)0x0) {
    bVar2 = cmTarget::IsImported(this_01);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar6 = std::operator<<((ostream *)&e,"cannot create target \"");
      poVar6 = std::operator<<(poVar6,(string *)name);
      std::operator<<(poVar6,"\" because an imported target with the same name already exists.");
      std::__cxx11::stringbuf::str();
LAB_0018f849:
      std::__cxx11::string::operator=((string *)msg,asStack_1c8);
      std::__cxx11::string::~string(asStack_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      unaff_R13B = 0;
    }
    else {
      PVar4 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0002,false);
      unaff_R13B = 1;
      if (PVar4 - REQUIRED_IF_USED < 2) {
        cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&e,(cmPolicies *)0x2,id);
        IssueMessage(this,FATAL_ERROR,(string *)&e);
      }
      else {
        if (PVar4 == OLD) goto LAB_0018f8de;
        if (PVar4 != WARN) {
          if (isCustom) {
            pcVar1 = this->GlobalGenerator->CMakeInstance;
            TVar5 = cmTarget::GetType(this_01);
            if ((TVar5 == UTILITY) && (pcVar7 = cmTarget::GetMakefile(this_01), pcVar7 != this)) {
              this_00 = (pcVar1->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&e,"ALLOW_DUPLICATE_CUSTOM_TARGETS",
                         (allocator<char> *)asStack_1c8);
              bVar2 = cmState::GetGlobalPropertyAsBool(this_00,(string *)&e);
              std::__cxx11::string::~string((string *)&e);
              if (bVar2) goto LAB_0018f8de;
            }
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          poVar6 = std::operator<<((ostream *)&e,"cannot create target \"");
          poVar6 = std::operator<<(poVar6,(string *)name);
          poVar6 = std::operator<<(poVar6,
                                   "\" because another target with the same name already exists.  ")
          ;
          std::operator<<(poVar6,"The existing target is ");
          TVar5 = cmTarget::GetType(this_01);
          if ((TVar5 < UNKNOWN_LIBRARY) && ((0xafU >> (TVar5 & 0x1f) & 1) != 0)) {
            std::operator<<((ostream *)&e,&DAT_00588280 + *(int *)(&DAT_00588280 + (ulong)TVar5 * 4)
                           );
          }
          poVar6 = std::operator<<((ostream *)&e,"created in source directory \"");
          pcVar7 = cmTarget::GetMakefile(this_01);
          psVar8 = GetCurrentSourceDirectory_abi_cxx11_(pcVar7);
          poVar6 = std::operator<<(poVar6,(string *)psVar8);
          poVar6 = std::operator<<(poVar6,"\".  ");
          std::operator<<(poVar6,"See documentation for policy CMP0002 for more details.");
          std::__cxx11::stringbuf::str();
          goto LAB_0018f849;
        }
        cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&e,(cmPolicies *)0x2,id);
        IssueMessage(this,AUTHOR_WARNING,(string *)&e);
      }
      std::__cxx11::string::~string((string *)&e);
    }
  }
LAB_0018f8de:
  bVar3 = this_01 == (cmTarget *)0x0 | unaff_R13B;
LAB_0018f8e7:
  return (bool)(bVar3 & 1);
}

Assistant:

bool cmMakefile::EnforceUniqueName(std::string const& name, std::string& msg,
                                   bool isCustom) const
{
  if (this->IsAlias(name)) {
    std::ostringstream e;
    e << "cannot create target \"" << name
      << "\" because an alias with the same name already exists.";
    msg = e.str();
    return false;
  }
  if (cmTarget* existing = this->FindTargetToUse(name)) {
    // The name given conflicts with an existing target.  Produce an
    // error in a compatible way.
    if (existing->IsImported()) {
      // Imported targets were not supported in previous versions.
      // This is new code, so we can make it an error.
      std::ostringstream e;
      e << "cannot create target \"" << name
        << "\" because an imported target with the same name already exists.";
      msg = e.str();
      return false;
    }
    // target names must be globally unique
    switch (this->GetPolicyStatus(cmPolicies::CMP0002)) {
      case cmPolicies::WARN:
        this->IssueMessage(MessageType::AUTHOR_WARNING,
                           cmPolicies::GetPolicyWarning(cmPolicies::CMP0002));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        return true;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0002));
        return true;
      case cmPolicies::NEW:
        break;
    }

    // The conflict is with a non-imported target.
    // Allow this if the user has requested support.
    cmake* cm = this->GetCMakeInstance();
    if (isCustom && existing->GetType() == cmStateEnums::UTILITY &&
        this != existing->GetMakefile() &&
        cm->GetState()->GetGlobalPropertyAsBool(
          "ALLOW_DUPLICATE_CUSTOM_TARGETS")) {
      return true;
    }

    // Produce an error that tells the user how to work around the
    // problem.
    std::ostringstream e;
    e << "cannot create target \"" << name
      << "\" because another target with the same name already exists.  "
      << "The existing target is ";
    switch (existing->GetType()) {
      case cmStateEnums::EXECUTABLE:
        e << "an executable ";
        break;
      case cmStateEnums::STATIC_LIBRARY:
        e << "a static library ";
        break;
      case cmStateEnums::SHARED_LIBRARY:
        e << "a shared library ";
        break;
      case cmStateEnums::MODULE_LIBRARY:
        e << "a module library ";
        break;
      case cmStateEnums::UTILITY:
        e << "a custom target ";
        break;
      case cmStateEnums::INTERFACE_LIBRARY:
        e << "an interface library ";
        break;
      default:
        break;
    }
    e << "created in source directory \""
      << existing->GetMakefile()->GetCurrentSourceDirectory() << "\".  "
      << "See documentation for policy CMP0002 for more details.";
    msg = e.str();
    return false;
  }
  return true;
}